

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::SourceCodeInfo_Location::Swap
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *other)

{
  SourceCodeInfo_Location *other_local;
  SourceCodeInfo_Location *this_local;
  
  if (other != this) {
    RepeatedField<int>::Swap(&this->path_,&other->path_);
    RepeatedField<int>::Swap(&this->span_,&other->span_);
    std::swap<std::__cxx11::string*>(&this->leading_comments_,&other->leading_comments_);
    std::swap<std::__cxx11::string*>(&this->trailing_comments_,&other->trailing_comments_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  }
  return;
}

Assistant:

void SourceCodeInfo_Location::Swap(SourceCodeInfo_Location* other) {
  if (other != this) {
    path_.Swap(&other->path_);
    span_.Swap(&other->span_);
    std::swap(leading_comments_, other->leading_comments_);
    std::swap(trailing_comments_, other->trailing_comments_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}